

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O1

void snap_restoreval(jit_State *J,GCtrace *T,ExitState *ex,SnapNo snapno,BloomFilter rfilt,IRRef ref
                    ,TValue *o)

{
  char *pcVar1;
  IRIns *ir;
  IRIns *pIVar2;
  anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 aVar3;
  TValue TVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  IRIns *pIVar10;
  lua_Number lVar11;
  
  uVar8 = (ulong)ref;
  pIVar2 = T->ir;
  do {
    ir = pIVar2 + uVar8;
    if ((uint)uVar8 < 0x8000) {
      if ((ir->field_1).o != '\x19') {
        lj_ir_kvalue(J->L,o,ir);
        return;
      }
      TVar4.field_2.it = 0;
      TVar4.field_2.field_0 =
           (anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0)(ir->field_1).op12;
LAB_00154113:
      *o = TVar4;
      return;
    }
    uVar7 = (uint)*(ushort *)((long)pIVar2 + uVar8 * 8 + 6);
    if (((rfilt >> (uVar8 & 0x3f) & 1) != 0) &&
       (uVar9 = (ulong)(T->nins - 1), *(char *)((long)pIVar2 + uVar9 * 8 + 5) == '\x14')) {
      pIVar10 = pIVar2 + uVar9;
      do {
        if (((uint)(pIVar10->field_0).op1 == (uint)uVar8) && ((pIVar10->field_0).op2 <= snapno)) {
          uVar7 = (uint)(pIVar10->field_0).prev;
        }
        pcVar1 = (char *)((long)pIVar10 + -3);
        pIVar10 = pIVar10 + -1;
      } while (*pcVar1 == '\x14');
    }
    uVar5 = (uint)*(byte *)((long)pIVar2 + uVar8 * 8 + 4);
    if (0xff < uVar7) {
      uVar7 = uVar7 >> 8;
      uVar6 = uVar5 & 0x1f;
      if (uVar6 - 0xf < 5) {
        lVar11 = (lua_Number)ex->spill[uVar7];
        goto LAB_001540e5;
      }
      if (((char)uVar6 != '\x03') && (uVar6 != 0xe)) {
        aVar3 = *(anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 *)
                 (ex->spill + uVar7);
LAB_00154122:
        (o->field_2).field_0 = aVar3;
LAB_00154126:
        (o->field_2).it = ~(uVar5 & 0x1f);
        return;
      }
      TVar4 = *(TValue *)(ex->spill + uVar7);
      goto LAB_00154113;
    }
    if (uVar7 < 0x80) {
      uVar6 = uVar5 & 0x1f;
      if (uVar6 - 0xf < 5) {
        lVar11 = (lua_Number)(int)ex->gpr[uVar7];
LAB_001540e5:
        o->n = lVar11;
        return;
      }
      if (uVar6 == 0xe) {
        lVar11 = ex->fpr[uVar7 - 0x10];
        goto LAB_001540e5;
      }
      if ((0x604208U >> uVar6 & 1) == 0) {
        if ((byte)uVar6 < 3) goto LAB_00154126;
        aVar3 = *(anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 *)
                 (ex->gpr + uVar7);
        goto LAB_00154122;
      }
      TVar4 = *(TValue *)(ex->gpr + uVar7);
      goto LAB_00154113;
    }
    uVar8 = (ulong)(ir->field_0).op1;
  } while( true );
}

Assistant:

static void snap_restoreval(jit_State *J, GCtrace *T, ExitState *ex,
			    SnapNo snapno, BloomFilter rfilt,
			    IRRef ref, TValue *o)
{
  IRIns *ir = &T->ir[ref];
  IRType1 t = ir->t;
  RegSP rs = ir->prev;
  if (irref_isk(ref)) {  /* Restore constant slot. */
    if (ir->o == IR_KPTR) {
      o->u64 = (uint64_t)(uintptr_t)ir_kptr(ir);
    } else {
      lj_assertJ(!(ir->o == IR_KKPTR || ir->o == IR_KNULL),
		 "restore of const from IR %04d with bad op %d",
		 ref - REF_BIAS, ir->o);
      lj_ir_kvalue(J->L, o, ir);
    }
    return;
  }
  if (LJ_UNLIKELY(bloomtest(rfilt, ref)))
    rs = snap_renameref(T, snapno, ref, rs);
  if (ra_hasspill(regsp_spill(rs))) {  /* Restore from spill slot. */
    int32_t *sps = &ex->spill[regsp_spill(rs)];
    if (irt_isinteger(t)) {
      setintV(o, *sps);
#if !LJ_SOFTFP32
    } else if (irt_isnum(t)) {
      o->u64 = *(uint64_t *)sps;
#endif
#if LJ_64 && !LJ_GC64
    } else if (irt_islightud(t)) {
      /* 64 bit lightuserdata which may escape already has the tag bits. */
      o->u64 = *(uint64_t *)sps;
#endif
    } else {
      lj_assertJ(!irt_ispri(t), "PRI ref with spill slot");
      setgcV(J->L, o, (GCobj *)(uintptr_t)*(GCSize *)sps, irt_toitype(t));
    }
  } else {  /* Restore from register. */
    Reg r = regsp_reg(rs);
    if (ra_noreg(r)) {
      lj_assertJ(ir->o == IR_CONV && ir->op2 == IRCONV_NUM_INT,
		 "restore from IR %04d has no reg", ref - REF_BIAS);
      snap_restoreval(J, T, ex, snapno, rfilt, ir->op1, o);
      if (LJ_DUALNUM) setnumV(o, (lua_Number)intV(o));
      return;
    } else if (irt_isinteger(t)) {
      setintV(o, (int32_t)ex->gpr[r-RID_MIN_GPR]);
#if !LJ_SOFTFP
    } else if (irt_isnum(t)) {
      setnumV(o, ex->fpr[r-RID_MIN_FPR]);
#elif LJ_64  /* && LJ_SOFTFP */
    } else if (irt_isnum(t)) {
      o->u64 = ex->gpr[r-RID_MIN_GPR];
#endif
#if LJ_64 && !LJ_GC64
    } else if (irt_is64(t)) {
      /* 64 bit values that already have the tag bits. */
      o->u64 = ex->gpr[r-RID_MIN_GPR];
#endif
    } else if (irt_ispri(t)) {
      setpriV(o, irt_toitype(t));
    } else {
      setgcV(J->L, o, (GCobj *)ex->gpr[r-RID_MIN_GPR], irt_toitype(t));
    }
  }
}